

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O0

bool miniros::service::waitForService(string *service_name,Duration *timeout)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  uint __seconds;
  TimeBase<miniros::WallTime,_miniros::WallDuration> *in_RSI;
  WallDuration *rhs;
  DurationBase<miniros::WallDuration> *rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bool enabled;
  WallTime current_time;
  bool result;
  bool printed;
  WallDuration wall_timeout;
  WallTime start_time;
  string mapped_name;
  bool in_stack_00000167;
  string *in_stack_00000168;
  undefined8 in_stack_fffffffffffffef8;
  Level LVar4;
  LogLocation *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  LogLocation *in_stack_ffffffffffffff10;
  void *logger_handle;
  Level level;
  undefined6 in_stack_ffffffffffffff28;
  byte in_stack_ffffffffffffff2f;
  TimeBase<miniros::WallTime,_miniros::WallDuration> in_stack_ffffffffffffff30;
  undefined5 in_stack_ffffffffffffff38;
  byte in_stack_ffffffffffffff3d;
  undefined1 in_stack_ffffffffffffff3e;
  allocator<char> local_a1;
  string local_a0 [36];
  WallDuration local_7c;
  undefined4 local_74;
  DurationBase<miniros::WallDuration> local_70;
  TimeBase<miniros::WallTime,_miniros::WallDuration> local_68;
  WallDuration local_60;
  byte local_56;
  byte local_55;
  DurationBase<miniros::WallDuration> local_54 [2];
  TimeBase<miniros::WallTime,_miniros::WallDuration> local_40;
  string local_38 [55];
  byte local_1;
  
  names::resolve(in_stack_ffffffffffffff08,SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
  local_40 = (TimeBase<miniros::WallTime,_miniros::WallDuration>)WallTime::now();
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         DurationBase<miniros::Duration>::toSec((DurationBase<miniros::Duration> *)in_RSI);
  WallDuration::WallDuration
            ((WallDuration *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
  local_55 = 0;
  local_56 = 0;
  do {
    uVar1 = ok();
    LVar4 = (Level)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    if (!(bool)uVar1) {
LAB_004a2f18:
      if (((local_55 & 1) != 0) && (uVar2 = ok(), (bool)uVar2)) {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((waitForService::loc.initialized_ ^ 0xffU) & 1) != 0) {
          level = (Level)((ulong)&local_a1 >> 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,(char *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff3e,
                                                          CONCAT15(in_stack_ffffffffffffff3d,
                                                                   in_stack_ffffffffffffff38))),
                     (allocator<char> *)in_stack_ffffffffffffff30);
          console::initializeLogLocation
                    ((LogLocation *)in_stack_ffffffffffffff30,
                     (string *)
                     CONCAT17(in_stack_ffffffffffffff2f,CONCAT16(uVar2,in_stack_ffffffffffffff28)),
                     level);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator(&local_a1);
        }
        if (waitForService::loc.level_ != Info) {
          console::setLogLocationLevel(in_stack_ffffffffffffff00,LVar4);
          console::checkLogLocationEnabled(in_stack_ffffffffffffff10);
        }
        LVar4 = waitForService::loc.level_;
        if ((waitForService::loc.logger_enabled_ & 1U) != 0) {
          logger_handle = waitForService::loc.logger_;
          uVar3 = std::__cxx11::string::c_str();
          console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service.cpp"
                         ,0x7b,
                         "bool miniros::service::waitForService(const std::string &, miniros::Duration)"
                         ,"waitForService: Service [%s] is now available.",uVar3);
        }
      }
      local_1 = local_56 & 1;
LAB_004a30df:
      local_74 = 1;
      WallDuration::~WallDuration((WallDuration *)0x4a30ec);
      std::__cxx11::string::~string(local_38);
      return (bool)(local_1 & 1);
    }
    in_stack_ffffffffffffff3e = exists(in_stack_00000168,in_stack_00000167);
    LVar4 = (Level)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    if ((bool)in_stack_ffffffffffffff3e) {
      local_56 = 1;
      goto LAB_004a2f18;
    }
    local_55 = 1;
    WallDuration::WallDuration
              ((WallDuration *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
    rhs = &local_60;
    in_stack_ffffffffffffff3d = DurationBase<miniros::WallDuration>::operator>=(local_54,rhs);
    __seconds = (uint)rhs;
    WallDuration::~WallDuration((WallDuration *)0x4a2ddb);
    if ((in_stack_ffffffffffffff3d & 1) != 0) {
      in_stack_ffffffffffffff30 =
           (TimeBase<miniros::WallTime,_miniros::WallDuration>)WallTime::now();
      local_68 = in_stack_ffffffffffffff30;
      TimeBase<miniros::WallTime,_miniros::WallDuration>::operator-(in_RSI,(WallTime *)this);
      rhs_00 = local_54;
      in_stack_ffffffffffffff2f =
           DurationBase<miniros::WallDuration>::operator>=(&local_70,(WallDuration *)rhs_00);
      __seconds = (uint)rhs_00;
      WallDuration::~WallDuration((WallDuration *)0x4a2e48);
      if ((in_stack_ffffffffffffff2f & 1) != 0) {
        local_1 = 0;
        goto LAB_004a30df;
      }
    }
    WallDuration::WallDuration
              ((WallDuration *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
    WallDuration::sleep(&local_7c,__seconds);
    WallDuration::~WallDuration((WallDuration *)0x4a2eeb);
  } while( true );
}

Assistant:

bool service::waitForService(const std::string& service_name, miniros::Duration timeout)
{
  std::string mapped_name = names::resolve(service_name);

  const WallTime start_time = WallTime::now();
  const WallDuration wall_timeout{timeout.toSec()};

  bool printed = false;
  bool result = false;
  while (miniros::ok())
  {
    if (exists(service_name, !printed))
    {
      result = true;
      break;
    }
    else
    {
      printed = true;

      if (wall_timeout >= WallDuration(0))
      {
        const WallTime current_time = WallTime::now();

        if ((current_time - start_time) >= wall_timeout)
        {
          return false;
        }
      }

      WallDuration(0.02).sleep();
    }
  }

  if (printed && miniros::ok())
  {
    MINIROS_INFO("waitForService: Service [%s] is now available.", mapped_name.c_str());
  }

  return result;
}